

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_ip4_addr(char *ip,int port,sockaddr_in *addr)

{
  int iVar1;
  
  addr->sin_zero[4] = '\0';
  addr->sin_zero[5] = '\0';
  addr->sin_zero[6] = '\0';
  addr->sin_zero[7] = '\0';
  addr->sin_addr = 0;
  addr->sin_zero[0] = '\0';
  addr->sin_zero[1] = '\0';
  addr->sin_zero[2] = '\0';
  addr->sin_zero[3] = '\0';
  addr->sin_family = 2;
  addr->sin_port = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = uv_inet_pton(2,ip,&addr->sin_addr);
  return iVar1;
}

Assistant:

int uv_ip4_addr(const char* ip, int port, struct sockaddr_in* addr) {
  memset(addr, 0, sizeof(*addr));
  addr->sin_family = AF_INET;
  addr->sin_port = htons(port);
#ifdef SIN6_LEN
  addr->sin_len = sizeof(*addr);
#endif
  return uv_inet_pton(AF_INET, ip, &(addr->sin_addr.s_addr));
}